

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

int absl::lts_20250127::str_format_internal::FprintF
              (FILE *output,UntypedFormatSpecImpl format,
              Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  FormatRawSinkImpl local_60;
  undefined1 local_50 [8];
  FILERawSink sink;
  FILE *output_local;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_local;
  UntypedFormatSpecImpl format_local;
  
  sink.count_ = (size_t)output;
  FILERawSink::FILERawSink((FILERawSink *)local_50,output);
  FormatRawSinkImpl::
  FormatRawSinkImpl<absl::lts_20250127::str_format_internal::FILERawSink,_nullptr>
            (&local_60,(FILERawSink *)local_50);
  bVar1 = FormatUntyped(local_60,format,args);
  if (bVar1) {
    iVar2 = FILERawSink::error((FILERawSink *)local_50);
    if (iVar2 == 0) {
      sVar4 = FILERawSink::count((FILERawSink *)local_50);
      iVar2 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar2 < sVar4) {
        piVar3 = __errno_location();
        *piVar3 = 0x1b;
        format_local.size_._4_4_ = -1;
      }
      else {
        sVar4 = FILERawSink::count((FILERawSink *)local_50);
        format_local.size_._4_4_ = (int)sVar4;
      }
    }
    else {
      iVar2 = FILERawSink::error((FILERawSink *)local_50);
      piVar3 = __errno_location();
      *piVar3 = iVar2;
      format_local.size_._4_4_ = -1;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    format_local.size_._4_4_ = -1;
  }
  return format_local.size_._4_4_;
}

Assistant:

int FprintF(std::FILE* output, const UntypedFormatSpecImpl format,
            absl::Span<const FormatArgImpl> args) {
  FILERawSink sink(output);
  if (!FormatUntyped(&sink, format, args)) {
    errno = EINVAL;
    return -1;
  }
  if (sink.error()) {
    errno = sink.error();
    return -1;
  }
  if (sink.count() > static_cast<size_t>(std::numeric_limits<int>::max())) {
    errno = EFBIG;
    return -1;
  }
  return static_cast<int>(sink.count());
}